

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlitePagerBegin(Pager *pPager)

{
  SyMemBackend *pBackend;
  int iVar1;
  Bitvec *pChunk;
  bitvec_rec **ppbVar2;
  bitvec_rec **ppbVar3;
  uint uVar4;
  bitvec_rec **ppbVar5;
  
  iVar1 = pager_shared_lock(pPager);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (1 < pPager->iState) {
    return 0;
  }
  if (pPager->is_rdonly != 0) {
    unqliteGenError(pPager->pDb,"Read-only database");
    return -0x4b;
  }
  iVar1 = pager_wait_on_lock(pPager,2);
  if (iVar1 == -0xe) {
    unqliteGenError(pPager->pDb,"Another process or thread have a reserved lock on this database");
    return -0xe;
  }
  if (iVar1 != 0) {
    return iVar1;
  }
  pBackend = pPager->pAllocator;
  pChunk = (Bitvec *)SyMemBackendAlloc(pBackend,0x20);
  if (pChunk != (Bitvec *)0x0) {
    pChunk->pAlloc = (SyMemBackend *)0x0;
    pChunk->nRec = 0;
    pChunk->nSize = 0;
    pChunk->apRec = (bitvec_rec **)0x0;
    pChunk->pList = (bitvec_rec *)0x0;
    pChunk->nSize = 0x40;
    ppbVar2 = (bitvec_rec **)SyMemBackendAlloc(pBackend,0x200);
    if (ppbVar2 != (bitvec_rec **)0x0) {
      uVar4 = pChunk->nSize << 3;
      if (uVar4 != 0) {
        ppbVar3 = (bitvec_rec **)((long)ppbVar2 + (ulong)uVar4);
        ppbVar5 = ppbVar2;
        do {
          *(undefined1 *)ppbVar5 = 0;
          if (ppbVar3 <= (bitvec_rec **)((long)ppbVar5 + 1)) break;
          *(undefined1 *)((long)ppbVar5 + 1) = 0;
          if (ppbVar3 <= (bitvec_rec **)((long)ppbVar5 + 2)) break;
          *(undefined1 *)((long)ppbVar5 + 2) = 0;
          if (ppbVar3 <= (bitvec_rec **)((long)ppbVar5 + 3)) break;
          *(undefined1 *)((long)ppbVar5 + 3) = 0;
          ppbVar5 = (bitvec_rec **)((long)ppbVar5 + 4);
        } while (ppbVar5 < ppbVar3);
      }
      pChunk->apRec = ppbVar2;
      pChunk->pAlloc = pBackend;
      goto LAB_0010e857;
    }
    SyMemBackendFree(pBackend,pChunk);
  }
  pChunk = (Bitvec *)0x0;
LAB_0010e857:
  pPager->pVec = pChunk;
  if (pChunk == (Bitvec *)0x0) {
    unqliteGenError(pPager->pDb,"unQLite is running out of memory");
    iVar1 = -1;
  }
  else {
    pPager->iState = 2;
    pPager->dbOrigSize = pPager->dbSize;
    pPager->iJournalOfft = 0;
    pPager->nRec = 0;
    if (pPager->dbSize != 0) {
      return 0;
    }
    iVar1 = pager_create_header(pPager);
    if (iVar1 == 0) {
      pPager->dbSize = 1;
      return 0;
    }
  }
  if (pPager->iLock != 0) {
    (*pPager->pfd->pMethods->xUnlock)(pPager->pfd,1);
    pPager->iLock = 1;
  }
  return iVar1;
}

Assistant:

UNQLITE_PRIVATE int unqlitePagerBegin(Pager *pPager)
{
	int rc;
	/* Obtain a shared lock on the database first */
	rc = pager_shared_lock(pPager);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( pPager->iState >= PAGER_WRITER_LOCKED ){
		return UNQLITE_OK;
	}
	if( pPager->is_rdonly ){
		unqliteGenError(pPager->pDb,"Read-only database");
		/* Read only database */
		return UNQLITE_READ_ONLY;
	}
	/* Obtain a reserved lock on the database */
	rc = pager_wait_on_lock(pPager,RESERVED_LOCK);
	if( rc == UNQLITE_OK ){
		/* Create the bitvec */
		pPager->pVec = unqliteBitvecCreate(pPager->pAllocator,pPager->dbSize);
		if( pPager->pVec == 0 ){
			unqliteGenOutofMem(pPager->pDb);
			rc = UNQLITE_NOMEM;
			goto fail;
		}
		/* Change to the WRITER_LOCK state */
		pPager->iState = PAGER_WRITER_LOCKED;
		pPager->dbOrigSize = pPager->dbSize;
		pPager->iJournalOfft = 0;
		pPager->nRec = 0;
		if( pPager->dbSize < 1 ){
			/* Write the  database header */
			rc = pager_create_header(pPager);
			if( rc != UNQLITE_OK ){
				goto fail;
			}
			pPager->dbSize = 1;
		}
	}else if( rc == UNQLITE_BUSY ){
		unqliteGenError(pPager->pDb,"Another process or thread have a reserved lock on this database");
	}
	return rc;
fail:
	/* Downgrade to shared lock */
	pager_unlock_db(pPager,SHARED_LOCK);
	return rc;
}